

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O1

Curve * __thiscall ON_ShutLining::FindCurve(ON_ShutLining *this,ON_UUID *id)

{
  int iVar1;
  CImplSL *pCVar2;
  char cVar3;
  Curve *unaff_RBX;
  Curve *this_00;
  CurveIterator it;
  CurveIterator local_38;
  ON_UUID local_30;
  
  CurveIterator::CurveIterator(&local_38,this);
  do {
    iVar1 = (local_38.m_impl)->m_index;
    pCVar2 = (local_38.m_impl)->m_sl->m_impl_sl;
    if (iVar1 < (pCVar2->m_curves).m_count) {
      (local_38.m_impl)->m_index = iVar1 + 1;
      this_00 = (pCVar2->m_curves).m_a[iVar1];
    }
    else {
      this_00 = (Curve *)0x0;
    }
    if (this_00 == (Curve *)0x0) {
      cVar3 = '\x03';
    }
    else {
      local_30 = Curve::Id(this_00);
      cVar3 = ::operator==(&local_30,id);
      if ((bool)cVar3) {
        unaff_RBX = this_00;
      }
    }
  } while (cVar3 == '\0');
  if (cVar3 == '\x03') {
    unaff_RBX = (Curve *)0x0;
  }
  CurveIterator::~CurveIterator(&local_38);
  return unaff_RBX;
}

Assistant:

ON_ShutLining::Curve* ON_ShutLining::FindCurve(const ON_UUID& id) const
{
  auto it = GetCurveIterator();
  while (Curve* curve = it.Next())
  {
    if (curve->Id() == id)
      return curve;
  }

  return nullptr;
}